

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

void __thiscall
duckdb::DuckSchemaEntry::Alter(DuckSchemaEntry *this,CatalogTransaction transaction,AlterInfo *info)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  CatalogSet *this_00;
  CatalogException *pCVar4;
  string local_70;
  string local_50;
  
  iVar3 = (*(info->super_ParseInfo)._vptr_ParseInfo[3])(info);
  this_00 = GetCatalogSet(this,(CatalogType)iVar3);
  if ((info->super_ParseInfo).field_0x9 == '\x04') {
    bVar2 = CatalogSet::AlterOwnership(this_00,transaction,(ChangeOwnershipInfo *)info);
    if (!bVar2) {
      pCVar4 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Couldn\'t change ownership!","");
      CatalogException::CatalogException(pCVar4,&local_70);
      __cxa_throw(pCVar4,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    pcVar1 = (info->name)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (info->name)._M_string_length);
    bVar2 = CatalogSet::AlterEntry(this_00,transaction,&local_70,info);
    if (!bVar2) {
      pCVar4 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      CatalogException::MissingEntry
                (pCVar4,(CatalogType)iVar3,&local_70,&local_50,(QueryErrorContext)0xffffffffffffffff
                );
      __cxa_throw(pCVar4,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DuckSchemaEntry::Alter(CatalogTransaction transaction, AlterInfo &info) {
	CatalogType type = info.GetCatalogType();

	auto &set = GetCatalogSet(type);
	if (info.type == AlterType::CHANGE_OWNERSHIP) {
		if (!set.AlterOwnership(transaction, info.Cast<ChangeOwnershipInfo>())) {
			throw CatalogException("Couldn't change ownership!");
		}
	} else {
		string name = info.name;
		if (!set.AlterEntry(transaction, name, info)) {
			throw CatalogException::MissingEntry(type, name, string());
		}
	}
}